

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int MMDB_aget_value(MMDB_entry_s *start,MMDB_entry_data_s *entry_data,char **path)

{
  uint32_t offset_00;
  MMDB_s *mmdb_00;
  char *path_elem_00;
  int iVar1;
  int status_2;
  int status_1;
  int i;
  char *path_elem;
  int status;
  uint32_t offset;
  MMDB_s *mmdb;
  char **path_local;
  MMDB_entry_data_s *entry_data_local;
  MMDB_entry_s *start_local;
  
  mmdb_00 = start->mmdb;
  offset_00 = start->offset;
  memset(entry_data,0,0x30);
  start_local._4_4_ = decode_one_follow(mmdb_00,offset_00,entry_data);
  if (start_local._4_4_ == 0) {
    if ((entry_data->has_data & 1U) == 0) {
      start_local._4_4_ = 8;
    }
    else {
      status_2 = 0;
      do {
        while( true ) {
          path_elem_00 = path[status_2];
          if (path_elem_00 == (char *)0x0) {
            return 0;
          }
          if (entry_data->type != 0xb) break;
          iVar1 = lookup_path_in_array(path_elem_00,mmdb_00,entry_data);
          status_2 = status_2 + 1;
          if (iVar1 != 0) {
            memset(entry_data,0,0x30);
            return iVar1;
          }
        }
        if (entry_data->type != 7) {
          memset(entry_data,0,0x30);
          return 9;
        }
        start_local._4_4_ = lookup_path_in_map(path_elem_00,mmdb_00,entry_data);
        status_2 = status_2 + 1;
      } while (start_local._4_4_ == 0);
      memset(entry_data,0,0x30);
    }
  }
  return start_local._4_4_;
}

Assistant:

int MMDB_aget_value(MMDB_entry_s *const start,
                    MMDB_entry_data_s *const entry_data,
                    const char *const *const path) {
    const MMDB_s *const mmdb = start->mmdb;
    uint32_t offset = start->offset;

    memset(entry_data, 0, sizeof(MMDB_entry_data_s));
    DEBUG_NL;
    DEBUG_MSG("looking up value by path");

    CHECKED_DECODE_ONE_FOLLOW(mmdb, offset, entry_data);

    DEBUG_NL;
    DEBUG_MSGF("top level element is a %s", type_num_to_name(entry_data->type));

    /* Can this happen? It'd probably represent a pathological case under
     * normal use, but there's nothing preventing someone from passing an
     * invalid MMDB_entry_s struct to this function */
    if (!entry_data->has_data) {
        return MMDB_INVALID_LOOKUP_PATH_ERROR;
    }

    const char *path_elem;
    int i = 0;
    while (NULL != (path_elem = path[i++])) {
        DEBUG_NL;
        DEBUG_MSGF("path elem = %s", path_elem);

        /* XXX - it'd be good to find a quicker way to skip through these
           entries that doesn't involve decoding them
           completely. Basically we need to just use the size from the
           control byte to advance our pointer rather than calling
           decode_one(). */
        if (entry_data->type == MMDB_DATA_TYPE_ARRAY) {
            int status = lookup_path_in_array(path_elem, mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                memset(entry_data, 0, sizeof(MMDB_entry_data_s));
                return status;
            }
        } else if (entry_data->type == MMDB_DATA_TYPE_MAP) {
            int status = lookup_path_in_map(path_elem, mmdb, entry_data);
            if (MMDB_SUCCESS != status) {
                memset(entry_data, 0, sizeof(MMDB_entry_data_s));
                return status;
            }
        } else {
            /* Once we make the code traverse maps & arrays without calling
             * decode_one() we can get rid of this. */
            memset(entry_data, 0, sizeof(MMDB_entry_data_s));
            return MMDB_LOOKUP_PATH_DOES_NOT_MATCH_DATA_ERROR;
        }
    }

    return MMDB_SUCCESS;
}